

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O0

void __thiscall mp::pre::ValuePresolverImpl::Add(ValuePresolverImpl *this,LinkRange br)

{
  LinkRange br_00;
  LinkRange br_01;
  bool bVar1;
  reference this_00;
  LinkIndexRange in_RDX;
  BasicLink *in_RSI;
  ValuePresolverImpl *in_stack_ffffffffffffffd0;
  BasicLink *in_stack_ffffffffffffffd8;
  LinkIndexRange in_stack_ffffffffffffffe0;
  
  bVar1 = std::deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>::empty
                    ((deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_> *)0x192cb9);
  if (!bVar1) {
    this_00 = std::deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>::back
                        ((deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_> *)
                         in_stack_ffffffffffffffd0);
    br_00.ir_ = in_RDX;
    br_00.b_ = in_RSI;
    in_stack_ffffffffffffffe0 = in_RDX;
    bVar1 = LinkRange::TryExtendBy(this_00,br_00);
    in_stack_ffffffffffffffd8 = in_RSI;
    if (bVar1) {
      return;
    }
  }
  ExportRemainingEntries(in_stack_ffffffffffffffd0);
  br_01.ir_ = in_stack_ffffffffffffffe0;
  br_01.b_ = in_stack_ffffffffffffffd8;
  LinkRangeList::Add((LinkRangeList *)in_RDX,br_01);
  return;
}

Assistant:

void Add(LinkRange br) {
    if (brl_.empty() || !brl_.back().TryExtendBy(br)) {
      ExportRemainingEntries();       // new entry, export existing
      brl_.Add(br);
    }
  }